

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O3

bool __thiscall bssl::Vector<unsigned_long>::MaybeGrow(Vector<unsigned_long> *this)

{
  ulong uVar1;
  size_t sVar2;
  unsigned_long *__dest;
  bool bVar3;
  int line;
  size_t sVar4;
  
  uVar1 = this->capacity_;
  bVar3 = true;
  if (this->size_ < uVar1) {
    return true;
  }
  if (uVar1 == 0) {
    sVar4 = 0x10;
LAB_0031ee26:
    __dest = (unsigned_long *)OPENSSL_malloc(sVar4 * 8);
    if (__dest == (unsigned_long *)0x0) {
      bVar3 = false;
    }
    else {
      sVar2 = this->size_;
      if (sVar2 != 0) {
        memmove(__dest,this->data_,sVar2 * 8);
      }
      OPENSSL_free(this->data_);
      this->data_ = __dest;
      this->size_ = sVar2;
      this->capacity_ = sVar4;
    }
  }
  else {
    if ((long)uVar1 < 0) {
      line = 0x14d;
    }
    else {
      if (uVar1 >> 0x3c == 0) {
        sVar4 = uVar1 * 2;
        goto LAB_0031ee26;
      }
      line = 0x153;
    }
    bVar3 = false;
    ERR_put_error(0xe,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_internal.h"
                  ,line);
  }
  return bVar3;
}

Assistant:

bool MaybeGrow() {
    // No need to grow if we have room for one more T.
    if (size_ < capacity_) {
      return true;
    }
    size_t new_capacity = kDefaultSize;
    if (capacity_ > 0) {
      // Double the array's size if it's safe to do so.
      if (capacity_ > SIZE_MAX / 2) {
        OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
        return false;
      }
      new_capacity = capacity_ * 2;
    }
    if (new_capacity > SIZE_MAX / sizeof(T)) {
      OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
      return false;
    }
    T *new_data =
        reinterpret_cast<T *>(OPENSSL_malloc(new_capacity * sizeof(T)));
    if (new_data == nullptr) {
      return false;
    }
    size_t new_size = size_;
    std::uninitialized_move(begin(), end(), new_data);
    clear();
    data_ = new_data;
    size_ = new_size;
    capacity_ = new_capacity;
    return true;
  }